

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestCaseWrapper.cpp
# Opt level: O3

bool __thiscall deqp::TestCaseWrapper::deinitTestCase(TestCaseWrapper *this,TestCase *testCase)

{
  (*(testCase->super_TestNode)._vptr_TestNode[3])(testCase);
  glu::resetState(this->m_context->m_renderCtx,this->m_context->m_contextInfo);
  return true;
}

Assistant:

bool TestCaseWrapper::deinitTestCase(tcu::TestCase* testCase)
{
	TestLog& log = m_testCtx.getLog();

	try
	{
		testCase->deinit();
	}
	catch (const tcu::Exception& e)
	{
		log << e;
		log << TestLog::Message << "Error in test case deinit, test program will terminate." << TestLog::EndMessage;
		return false;
	}

	try
	{
		// Clear state to defaults
		glu::resetState(m_context.getRenderContext(), m_context.getContextInfo());
	}
	catch (const std::exception& e)
	{
		log << e;
		log << TestLog::Message << "Error in state reset, test program will terminate." << TestLog::EndMessage;
		return false;
	}

	return true;
}